

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

bool __thiscall
testing::internal::ValuesInIteratorRangeGenerator<(anonymous_namespace)::TestEncodeParam>::Iterator
::Equals(Iterator *this,ParamIteratorInterface<(anonymous_namespace)::TestEncodeParam> *other)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  GTestLog local_20;
  GTestLog local_1c;
  
  iVar2 = (*(this->super_ParamIteratorInterface<(anonymous_namespace)::TestEncodeParam>).
            _vptr_ParamIteratorInterface[2])();
  iVar3 = (*other->_vptr_ParamIteratorInterface[2])(other);
  bVar1 = IsTrue(CONCAT44(extraout_var,iVar2) == CONCAT44(extraout_var_00,iVar3));
  if (!bVar1) {
    GTestLog::GTestLog(&local_20,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                       ,0x156);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition BaseGenerator() == other.BaseGenerator() failed. ",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"The program attempted to compare iterators ",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"from different generators.",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    GTestLog::~GTestLog(&local_20);
  }
  __s1 = *(char **)(other->_vptr_ParamIteratorInterface[-1] + 8);
  if (__s1 == 
      "N7testing8internal30ValuesInIteratorRangeGeneratorIN12_GLOBAL__N_115TestEncodeParamEE8IteratorE"
     ) {
    bVar1 = true;
  }
  else if (*__s1 == '*') {
    bVar1 = false;
  }
  else {
    iVar2 = strcmp(__s1,
                   "N7testing8internal30ValuesInIteratorRangeGeneratorIN12_GLOBAL__N_115TestEncodeParamEE8IteratorE"
                  );
    bVar1 = iVar2 == 0;
  }
  bVar1 = IsTrue(bVar1);
  if (!bVar1) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-port.h"
                       ,0x45e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition typeid(*base) == typeid(Derived) failed. ",0x33);
    GTestLog::~GTestLog(&local_1c);
  }
  lVar4 = __dynamic_cast(other,&ParamIteratorInterface<(anonymous_namespace)::TestEncodeParam>::
                                typeinfo,&typeinfo,0);
  return (this->iterator_)._M_current ==
         *(anon_struct_8_2_7f46c34e_for__M_head_impl **)(lVar4 + 0x10);
}

Assistant:

bool Equals(const ParamIteratorInterface<T>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      return iterator_ ==
             CheckedDowncastToActualType<const Iterator>(&other)->iterator_;
    }